

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O0

DdNode * GetSingleOutputFunction
                   (DdManager *dd,DdNode **pbOuts,int nOuts,DdNode **pbVarsEnc,int nVarsEnc,
                   int fVerbose)

{
  int iVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *n;
  int local_1068 [2];
  int Order [1024];
  DdNode *bProd;
  DdNode *bTemp;
  DdNode *bCube;
  DdNode *aResult;
  DdNode *bResult;
  int i;
  int fVerbose_local;
  int nVarsEnc_local;
  DdNode **pbVarsEnc_local;
  int nOuts_local;
  DdNode **pbOuts_local;
  DdManager *dd_local;
  
  for (bResult._4_4_ = 0; bResult._4_4_ < nOuts; bResult._4_4_ = bResult._4_4_ + 1) {
    iVar1 = Cudd_SupportSize(dd,pbOuts[bResult._4_4_]);
    s_SuppSize[bResult._4_4_] = iVar1;
    Order[(long)bResult._4_4_ + -2] = bResult._4_4_;
  }
  qsort(local_1068,(long)nOuts,4,CompareSupports);
  aResult = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(aResult);
  for (bResult._4_4_ = 0; bResult._4_4_ < nOuts; bResult._4_4_ = bResult._4_4_ + 1) {
    pDVar3 = Extra_bddBitsToCube(dd,bResult._4_4_,nVarsEnc,pbVarsEnc,1);
    Cudd_Ref(pDVar3);
    n = Cudd_bddAnd(dd,pDVar3,pbOuts[Order[(long)bResult._4_4_ + -2]]);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(dd,pDVar3);
    pDVar3 = Cudd_bddOr(dd,n,aResult);
    Cudd_Ref(pDVar3);
    Cudd_RecursiveDeref(dd,aResult);
    Cudd_RecursiveDeref(dd,n);
    aResult = pDVar3;
  }
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(aResult);
    printf("Single BDD size = %6d nodes\n",(ulong)uVar2);
  }
  pDVar3 = Cudd_BddToAdd(dd,aResult);
  Cudd_Ref(pDVar3);
  Cudd_RecursiveDeref(dd,aResult);
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(pDVar3);
    printf("MTBDD           = %6d nodes\n",(ulong)uVar2);
  }
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * GetSingleOutputFunction( DdManager * dd, DdNode ** pbOuts, int nOuts, DdNode ** pbVarsEnc, int nVarsEnc, int fVerbose )
{
    int i;
    DdNode * bResult, * aResult;
    DdNode * bCube, * bTemp, * bProd;

    int Order[MAXOUTPUTS];
//  int OrderMint[MAXOUTPUTS];
 
    // sort the output according to their support size
    for ( i = 0; i < nOuts; i++ )
    {
        s_SuppSize[i] = Cudd_SupportSize( dd, pbOuts[i] );
//      s_MintOnes[i] = BitCount8[i];
        Order[i]      = i;
//      OrderMint[i]  = i;
    }
    
    // order the outputs
    qsort( (void*)Order,     (size_t)nOuts, sizeof(int), (int(*)(const void*, const void*)) CompareSupports );
    // order the outputs
//  qsort( (void*)OrderMint, (size_t)nOuts, sizeof(int), (int(*)(const void*, const void*)) CompareMinterms );


    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nOuts; i++ )
    {
//      bCube   = Cudd_bddBitsToCube( dd, OrderMint[i], nVarsEnc, pbVarsEnc );   Cudd_Ref( bCube );
//      bProd   = Cudd_bddAnd( dd, bCube, pbOuts[Order[nOuts-1-i]] );         Cudd_Ref( bProd );
        bCube   = Extra_bddBitsToCube( dd, i, nVarsEnc, pbVarsEnc, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbOuts[Order[i]] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );           Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    // convert to the ADD
if ( fVerbose )
printf( "Single BDD size = %6d nodes\n", Cudd_DagSize(bResult) );
    aResult = Cudd_BddToAdd( dd, bResult );  Cudd_Ref( aResult );
    Cudd_RecursiveDeref( dd, bResult );
if ( fVerbose )
printf( "MTBDD           = %6d nodes\n", Cudd_DagSize(aResult) );
    Cudd_Deref( aResult );
    return aResult;
}